

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O1

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::
make_constraint<spvtools::opt::DependenceDistance,spvtools::opt::SENode*&,spvtools::opt::Loop_const*&>
          (LoopDependenceAnalysis *this,SENode **args,Loop **args_1)

{
  size_t *psVar1;
  SENode *pSVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  p_Var3 = (_List_node_base *)operator_new(0x18);
  pSVar2 = *args;
  p_Var3->_M_prev = (_List_node_base *)*args_1;
  p_Var3->_M_next = (_List_node_base *)&PTR_GetType_00b1f618;
  p_Var3[1]._M_next = (_List_node_base *)pSVar2;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = p_Var3;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->constraints_).
            super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return (Constraint *)
         (this->constraints_).
         super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

Constraint* make_constraint(Args&&... args) {
    constraints_.push_back(
        std::unique_ptr<Constraint>(new T(std::forward<Args>(args)...)));

    return constraints_.back().get();
  }